

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O0

bool __thiscall MathInterpreter::isVariable(MathInterpreter *this,string *s)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  size_t size;
  uint i;
  string *s_local;
  MathInterpreter *this_local;
  
  uVar2 = std::__cxx11::string::size();
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
  if ((('z' < *pcVar3) ||
      (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar3 < 'a')) &&
     ((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s), 'Z' < *pcVar3 ||
      (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar3 < 'A')))) {
    return false;
  }
  size._4_4_ = 1;
  do {
    bVar1 = false;
    if (size._4_4_ < uVar2) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
      if (*pcVar3 < '{') {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
        bVar1 = true;
        if ('`' < *pcVar3) goto LAB_0011cc0e;
      }
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
      if (*pcVar3 < '[') {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
        bVar1 = true;
        if ('@' < *pcVar3) goto LAB_0011cc0e;
      }
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
      bVar1 = true;
      if (*pcVar3 != '_') {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
        bVar1 = false;
        if (*pcVar3 < ':') {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
          bVar1 = '/' < *pcVar3;
        }
      }
    }
LAB_0011cc0e:
    if (!bVar1) {
      if (size._4_4_ != uVar2) {
        return false;
      }
      return true;
    }
    size._4_4_ = size._4_4_ + 1;
  } while( true );
}

Assistant:

bool MathInterpreter::isVariable(string s) {
  unsigned int i = 0;
  std::size_t size = s.size();
  if (((s[i] <= 'z') && (s[i] >= 'a')) || ((s[i] <= 'Z') && (s[i] >= 'A'))) {
    i++;
    while (i < size && (((s[i] <= 'z') && (s[i] >= 'a'))
        || ((s[i] <= 'Z') && (s[i] >= 'A')) || (s[i] == '_')
        || ((s[i] <= '9') && (s[i] >= '0')))) {
      i++;
    }
    if (i == size) {
      return true;
    }
  }
  return false;
}